

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedFileReader.h
# Opt level: O2

void __thiscall
FileReaderData::FileReaderData(FileReaderData *this,uint32_t blockSize,uint32_t allocSize)

{
  ReaderData::ReaderData(&this->super_ReaderData);
  (this->super_ReaderData)._vptr_ReaderData = (_func_int **)&PTR__FileReaderData_00249f28;
  File::File(&this->m_file);
  this->m_fileHeaderSize = 0;
  return;
}

Assistant:

FileReaderData(uint32_t blockSize, uint32_t allocSize) : m_fileHeaderSize(0) {}